

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_compressionParameters cParams)

{
  ZSTD_cwksp *ws;
  undefined1 auVar1 [16];
  size_t err_code;
  size_t sVar2;
  void *__dest;
  U32 *pUVar3;
  ZSTD_CCtx_params params;
  
  sVar2 = ZSTD_checkCParams(cParams);
  if (sVar2 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3742,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                 );
  }
  (cdict->matchState).cParams.searchLog = cParams.searchLog;
  (cdict->matchState).cParams.minMatch = cParams.minMatch;
  (cdict->matchState).cParams.targetLength = cParams.targetLength;
  (cdict->matchState).cParams.strategy = cParams.strategy;
  (cdict->matchState).cParams.windowLog = cParams.windowLog;
  (cdict->matchState).cParams.chainLog = cParams.chainLog;
  (cdict->matchState).cParams.hashLog = cParams.hashLog;
  (cdict->matchState).cParams.searchLog = cParams.searchLog;
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,dictSize + 7 & 0xfffffffffffffff8);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  ws = &cdict->workspace;
  pUVar3 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x1800);
  cdict->entropyWorkspace = pUVar3;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  sVar2 = ZSTD_reset_matchState
                    (&cdict->matchState,ws,&cParams,ZSTDcrp_makeClean,ZSTDirp_reset,
                     ZSTD_resetTarget_CDict);
  if (sVar2 < 0xffffffffffffff89) {
    params.ldmParams._0_16_ = ZEXT816(0) << 0x40;
    params.customMem.customFree = (ZSTD_freeFunction)0x0;
    params.customMem.opaque = (void *)0x0;
    params._64_32_ = ZEXT1632((undefined1  [16])params.ldmParams._0_16_);
    params.ldmParams.hashRateLog = 0;
    params.ldmParams.windowLog = 0;
    params.customMem.customAlloc = (ZSTD_allocFunction)0x0;
    params.fParams = params.ldmParams._0_12_;
    params.compressionLevel = 3;
    params._32_32_ = ZEXT1632(CONCAT124(params._36_12_,1));
    auVar1._12_4_ = cParams.searchLog;
    auVar1._8_4_ = cParams.hashLog;
    params.cParams.minMatch = cParams.minMatch;
    params.cParams.searchLog = cParams.searchLog;
    auVar1._0_4_ = cParams.windowLog;
    auVar1._4_4_ = cParams.chainLog;
    params._0_16_ = auVar1 << 0x20;
    params.cParams.targetLength = cParams.targetLength;
    params.cParams.strategy = cParams.strategy;
    sVar2 = ZSTD_compress_insertDictionary
                      (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,ws,&params,
                       cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                       cdict->entropyWorkspace);
    if (sVar2 < 0xffffffffffffff89) {
      if (sVar2 >> 0x20 != 0) {
        __assert_fail("dictID <= (size_t)(U32)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3767,
                      "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_compressionParameters)"
                     );
      }
      cdict->dictID = (U32)sVar2;
      sVar2 = 0;
    }
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_compressionParameters cParams)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(cParams));
    cdict->matchState.cParams = cParams;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation);
        cdict->dictContent = internalBuffer;
        memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &cParams,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict));
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   ZSTD_CCtx_params params;
        memset(&params, 0, sizeof(params));
        params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        params.cParams = cParams;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID);
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}